

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_realloc(mspace msp,void *oldmem,size_t bytes)

{
  int *piVar1;
  mchunkptr pmVar2;
  void *pvVar3;
  size_t nb;
  ulong __n;
  
  if (oldmem == (void *)0x0) {
    pvVar3 = mspace_malloc(msp,bytes);
    return pvVar3;
  }
  if (bytes < 0xffffffffffffff80) {
    nb = 0x20;
    if (0x16 < bytes) {
      nb = bytes + 0x17 & 0xfffffffffffffff0;
    }
    pmVar2 = try_realloc_chunk((mstate)msp,(mchunkptr)((long)oldmem + -0x10),nb,1);
    if (pmVar2 != (mchunkptr)0x0) {
      return &pmVar2->fd;
    }
    pvVar3 = mspace_malloc(msp,bytes);
    if (pvVar3 != (void *)0x0) {
      __n = ((ulong)((*(ulong *)((long)oldmem + -8) & 3) != 0) << 3 | 0xfffffffffffffff0) +
            (*(ulong *)((long)oldmem + -8) & 0xfffffffffffffff8);
      if (bytes <= __n) {
        __n = bytes;
      }
      memcpy(pvVar3,oldmem,__n);
      mspace_free(msp,oldmem);
      return pvVar3;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* mspace_realloc(mspace msp, void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = mspace_malloc(msp, bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    mspace_free(msp, oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = (mstate)msp;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = mspace_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          mspace_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}